

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeDataSegments(WasmBinaryWriter *this)

{
  pointer puVar1;
  char *data;
  uint32_t uVar2;
  DataSegment *pDVar3;
  ulong __n;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  void *__buf_01;
  void *extraout_RDX_01;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment;
  pointer puVar4;
  LEB<unsigned_int,_unsigned_char> local_44;
  LEB<unsigned_int,_unsigned_char> local_40;
  LEB<unsigned_int,_unsigned_char> local_3c;
  int32_t local_38;
  uchar local_31;
  
  puVar4 = (this->wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (this->wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != puVar1) {
    if (800000 < (ulong)((long)puVar4 - (long)puVar1)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Some VMs may not accept this binary because it has a large "
                 ,0x3b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"number of data segments. Run the limit-segments pass to ",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"merge segments.\n",0x10);
    }
    local_38 = startSection<wasm::BinaryConsts::Section>(this,Data);
    __n = (ulong)((long)(this->wasm->dataSegments).
                        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->wasm->dataSegments).
                       super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
    local_44.value = (uint)__n;
    LEB<unsigned_int,_unsigned_char>::write(&local_44,(int)this->o,__buf,__n);
    puVar4 = (this->wasm->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->wasm->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar4 != puVar1) {
      __buf_00 = extraout_RDX;
      do {
        pDVar3 = (puVar4->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar3->isPassive == false) {
          uVar2 = getMemoryIndex(this,(Name)(pDVar3->memory).super_IString.str);
          local_3c.value = (uint)(uVar2 != 0) * 2;
          __buf_00 = extraout_RDX_00;
        }
        else {
          local_3c.value = 1;
          uVar2 = 0;
        }
        LEB<unsigned_int,_unsigned_char>::write(&local_3c,(int)this->o,__buf_00,__n);
        pDVar3 = (puVar4->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar3->isPassive == false) {
          if (uVar2 != 0) {
            local_40.value = uVar2;
            LEB<unsigned_int,_unsigned_char>::write(&local_40,(int)this->o,__buf_01,__n);
            pDVar3 = (puVar4->_M_t).
                     super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
          }
          writeExpression(this,pDVar3->offset);
          local_31 = '\v';
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_31
                    );
          pDVar3 = (puVar4->_M_t).
                   super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                   .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        }
        data = (pDVar3->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
        writeInlineBuffer(this,data,
                          (long)*(pointer *)
                                 ((long)&(pDVar3->data).
                                         super__Vector_base<char,_std::allocator<char>_>._M_impl + 8
                                 ) - (long)data);
        puVar4 = puVar4 + 1;
        __buf_00 = extraout_RDX_01;
      } while (puVar4 != puVar1);
    }
    finishSection(this,local_38);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDataSegments() {
  if (wasm->dataSegments.size() == 0) {
    return;
  }
  if (wasm->dataSegments.size() > WebLimitations::MaxDataSegments) {
    std::cerr << "Some VMs may not accept this binary because it has a large "
              << "number of data segments. Run the limit-segments pass to "
              << "merge segments.\n";
  }
  auto start = startSection(BinaryConsts::Section::Data);
  o << U32LEB(wasm->dataSegments.size());
  for (auto& segment : wasm->dataSegments) {
    uint32_t flags = 0;
    Index memoryIndex = 0;
    if (segment->isPassive) {
      flags |= BinaryConsts::IsPassive;
    } else {
      memoryIndex = getMemoryIndex(segment->memory);
      if (memoryIndex) {
        flags |= BinaryConsts::HasIndex;
      }
    }
    o << U32LEB(flags);
    if (!segment->isPassive) {
      if (memoryIndex) {
        o << U32LEB(memoryIndex);
      }
      writeExpression(segment->offset);
      o << int8_t(BinaryConsts::End);
    }
    writeInlineBuffer(segment->data.data(), segment->data.size());
  }
  finishSection(start);
}